

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cc
# Opt level: O0

char __thiscall mcc::Scanner::Next(Scanner *this)

{
  ErrorReporter *pEVar1;
  int iVar2;
  TokenType TVar3;
  element_type *peVar4;
  string *psVar5;
  char *pcVar6;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [24];
  int line;
  undefined1 local_30 [8];
  shared_ptr<mcc::Token> token;
  char c;
  Scanner *this_local;
  
  if (this->putback_ == '\0') {
    iVar2 = fgetc((FILE *)this->source_stream_);
    token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         (char)iVar2;
    if (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ ==
        -1) {
      return -1;
    }
    while (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
           == '#') {
      GetToken((Scanner *)local_30);
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      TVar3 = Token::GetType(peVar4);
      if (TVar3 != T_INT_LIT) {
        pEVar1 = this->reporter_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&line,"Invalid preprocessor output",
                   (allocator<char> *)(local_78 + 0x17));
        ErrorReporter::Report
                  (pEVar1,(string *)&line,
                   token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._7_1_,this->line_,this->c_);
        std::__cxx11::string::~string((string *)&line);
        std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x17));
      }
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      local_78._16_4_ = Token::Int(peVar4);
      GetToken((Scanner *)local_78);
      std::shared_ptr<mcc::Token>::operator=
                ((shared_ptr<mcc::Token> *)local_30,(shared_ptr<mcc::Token> *)local_78);
      std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_78);
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      TVar3 = Token::GetType(peVar4);
      if (TVar3 != T_STR_LIT) {
        pEVar1 = this->reporter_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Invalid preprocessor output",&local_99);
        ErrorReporter::Report
                  (pEVar1,&local_98,
                   token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._7_1_,this->line_,this->c_);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
      }
      peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      psVar5 = Token::String_abi_cxx11_(peVar4);
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psVar5);
      if (*pcVar6 != '<') {
        pEVar1 = this->reporter_;
        peVar4 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
        psVar5 = Token::String_abi_cxx11_(peVar4);
        ErrorReporter::SetFile(pEVar1,psVar5);
        this->line_ = local_78._16_4_;
      }
      do {
        iVar2 = fgetc((FILE *)this->source_stream_);
        token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
             (char)iVar2;
      } while (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _7_1_ != '\n');
      iVar2 = fgetc((FILE *)this->source_stream_);
      token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
           (char)iVar2;
      std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_30);
    }
  }
  else {
    token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
         this->putback_;
    this->putback_ = '\0';
    this->c_ = this->c_ + -1;
  }
  this->c_ = this->c_ + 1;
  if (token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ ==
      '\n') {
    this->line_ = this->line_ + 1;
    this->c_ = 0;
  }
  return token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_;
}

Assistant:

char Scanner::Next() {
  char c;

  if (putback_ != '\0') {
    c = putback_;
    putback_ = '\0';
    c_--;
  } else {
    c = (char) fgetc(source_stream_);
    if (c == EOF) { // eof
      return EOF;
    }

    while (c == '#') { // preprocessor lines
      std::shared_ptr<Token> token = GetToken();
      if (token->GetType() != TokenType::T_INT_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      int line = token->Int();

      token = GetToken();
      if (token->GetType() != TokenType::T_STR_LIT)
        reporter_.Report("Invalid preprocessor output", c, line_, c_);

      if (token->String()[0] != '<') {
        reporter_.SetFile(token->String());
        line_ = line;
      }

      while ((c = (char) fgetc(source_stream_)) != '\n');
      c = (char) fgetc(source_stream_);
    }
  }

  c_++;
  if (c == '\n') {
    line_++;
    c_ = 0;
  }

  return c;
}